

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# str_cat.h
# Opt level: O3

string * __thiscall
absl::StrCat<std::__cxx11::string>
          (string *__return_storage_ptr__,absl *this,string_view first,
          basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *rest)

{
  size_type *psVar1;
  long lVar2;
  undefined8 uVar3;
  undefined8 *puVar4;
  ulong uVar5;
  ulong *local_60;
  long local_58;
  ulong local_50 [2];
  ulong *local_40;
  long local_38;
  ulong local_30 [2];
  
  local_40 = local_30;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)&local_40,first._M_len,this + first._M_len);
  lVar2 = *(long *)first._M_str;
  local_60 = local_50;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)&local_60,lVar2,*(long *)((long)first._M_str + 8) + lVar2);
  uVar5 = 0xf;
  if (local_40 != local_30) {
    uVar5 = local_30[0];
  }
  if (uVar5 < (ulong)(local_58 + local_38)) {
    uVar5 = 0xf;
    if (local_60 != local_50) {
      uVar5 = local_50[0];
    }
    if ((ulong)(local_58 + local_38) <= uVar5) {
      puVar4 = (undefined8 *)
               std::__cxx11::string::replace((ulong)&local_60,0,(char *)0x0,(ulong)local_40);
      goto LAB_001c5217;
    }
  }
  puVar4 = (undefined8 *)std::__cxx11::string::_M_append((char *)&local_40,(ulong)local_60);
LAB_001c5217:
  (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
  psVar1 = puVar4 + 2;
  if ((size_type *)*puVar4 == psVar1) {
    uVar3 = puVar4[3];
    (__return_storage_ptr__->field_2)._M_allocated_capacity = *psVar1;
    *(undefined8 *)((long)&__return_storage_ptr__->field_2 + 8) = uVar3;
  }
  else {
    (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)*puVar4;
    (__return_storage_ptr__->field_2)._M_allocated_capacity = *psVar1;
  }
  __return_storage_ptr__->_M_string_length = puVar4[1];
  *puVar4 = psVar1;
  puVar4[1] = 0;
  *(undefined1 *)psVar1 = 0;
  if (local_60 != local_50) {
    operator_delete(local_60,local_50[0] + 1);
  }
  if (local_40 != local_30) {
    operator_delete(local_40,local_30[0] + 1);
  }
  return __return_storage_ptr__;
}

Assistant:

inline std::string StrCat(absl::string_view first, const T &...rest) {
  return StrCat(first) + StrCat(rest...);
}